

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O0

void __thiscall
MeCab::scoped_ptr<MeCab::DictionaryRewriter>::reset
          (scoped_ptr<MeCab::DictionaryRewriter> *this,DictionaryRewriter *p)

{
  pointer pRVar1;
  pointer in_RSI;
  DictionaryRewriter *in_RDI;
  
  pRVar1 = (in_RDI->unigram_rewrite_).
           super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
           super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pRVar1 != (pointer)0x0) {
    DictionaryRewriter::~DictionaryRewriter(in_RDI);
    operator_delete(pRVar1);
  }
  (in_RDI->unigram_rewrite_).
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = in_RSI;
  return;
}

Assistant:

void reset(T * p = 0) {
    delete ptr_;
    ptr_ = p;
  }